

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O1

int get_next_relative_field_bit_offset
              (coda_cursor_conflict *cursor,int64_t *rel_bit_offset,int64_t *current_field_size)

{
  coda_dynamic_type_struct *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int available;
  int64_t bit_size;
  int local_344;
  coda_cursor_conflict local_340;
  
  lVar5 = (long)cursor->n;
  pcVar1 = cursor->stack[lVar5 + -2].type;
  lVar6 = (long)((int)cursor->stack[lVar5 + -1].index + 1);
  if ((long)pcVar1[4].definition <= lVar6) {
    __assert_fail("field_index < record->num_fields",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                  ,0xa1,
                  "int get_next_relative_field_bit_offset(const coda_cursor *, int64_t *, int64_t *)"
                 );
  }
  lVar6 = *(long *)(*(long *)(pcVar1 + 5) + lVar6 * 8);
  if (*(long *)(lVar6 + 0x28) < 0) {
    lVar5 = cursor->stack[lVar5 + -1].bit_offset - cursor->stack[lVar5 + -2].bit_offset;
    if (*(long *)(lVar6 + 0x30) == 0) {
      iVar4 = coda_cursor_get_bit_size(cursor,(int64_t *)&local_340);
      iVar3 = -1;
      if (iVar4 == 0) {
        *rel_bit_offset = lVar5 + (long)local_340.product;
        iVar3 = 0;
        if (current_field_size != (int64_t *)0x0) {
          *current_field_size = (int64_t)local_340.product;
          iVar3 = 0;
        }
      }
    }
    else {
      memcpy(&local_340,cursor,0x310);
      local_340.n = local_340.n + -1;
      if (current_field_size != (int64_t *)0x0) {
        *current_field_size = -1;
      }
      if (*(coda_expression **)(lVar6 + 0x20) != (coda_expression *)0x0) {
        iVar3 = coda_expression_eval_bool(*(coda_expression **)(lVar6 + 0x20),&local_340,&local_344)
        ;
        if (iVar3 == 0) {
          if (local_344 == 0) {
            *rel_bit_offset = lVar5;
            iVar3 = 0;
            bVar2 = false;
          }
          else {
            bVar2 = true;
            iVar3 = 0;
          }
        }
        else {
          bVar2 = false;
          coda_add_error_message(" for available expression");
          coda_cursor_add_to_error_message(cursor);
          iVar3 = -1;
        }
        if (!bVar2) {
          return iVar3;
        }
      }
      iVar3 = coda_expression_eval_integer
                        (*(coda_expression **)(lVar6 + 0x30),&local_340,rel_bit_offset);
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        coda_add_error_message(" for offset expression");
        coda_cursor_add_to_error_message(cursor);
        iVar3 = -1;
      }
    }
  }
  else {
    *rel_bit_offset = *(long *)(lVar6 + 0x28);
    iVar3 = 0;
    if (current_field_size != (int64_t *)0x0) {
      *current_field_size = -1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int get_next_relative_field_bit_offset(const coda_cursor *cursor, int64_t *rel_bit_offset,
                                              int64_t *current_field_size)
{
    coda_type_record_field *field;
    coda_type_record *record;
    int64_t prev_bit_offset;
    int64_t bit_size;
    int field_index;

    record = (coda_type_record *)cursor->stack[cursor->n - 2].type;
    field_index = cursor->stack[cursor->n - 1].index + 1;
    assert(field_index < record->num_fields);
    field = record->field[field_index];

    if (field->bit_offset >= 0)
    {
        /* use static offset */
        *rel_bit_offset = field->bit_offset;
        if (current_field_size != NULL)
        {
            *current_field_size = -1;   /* not calculated */
        }
        return 0;
    }

    prev_bit_offset = cursor->stack[cursor->n - 1].bit_offset - cursor->stack[cursor->n - 2].bit_offset;

    if (field->bit_offset_expr != NULL)
    {
        coda_cursor record_cursor;

        record_cursor = *cursor;
        record_cursor.n--;
        if (current_field_size != NULL)
        {
            *current_field_size = -1;   /* not calculated */
        }

        if (field->available_expr != NULL)
        {
            int available;

            if (coda_expression_eval_bool(field->available_expr, &record_cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            /* don't evaluate offset expression if field is not available! */
            if (!available)
            {
                /* the size of this field is zero, so just use the offset of the previous field */
                *rel_bit_offset = prev_bit_offset;
                return 0;
            }
        }
        /* determine offset using expr */
        if (coda_expression_eval_integer(field->bit_offset_expr, &record_cursor, rel_bit_offset) != 0)
        {
            coda_add_error_message(" for offset expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    /* determine offset by using bit_offset of current field and adding its bit size */
    if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
    {
        return -1;
    }
    *rel_bit_offset = prev_bit_offset + bit_size;
    if (current_field_size != NULL)
    {
        *current_field_size = bit_size;
    }

    return 0;
}